

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O1

PSpriteAmiga __thiscall
DataSourceAmiga::make_shadow_from_symbol(DataSourceAmiga *this,PSpriteAmiga *symbol)

{
  _func_int **pp_Var1;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSpriteAmiga PVar2;
  undefined1 local_61;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined8 local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined8 local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  int local_20 [2];
  
  local_20[1] = 10;
  local_20[0] = 10;
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<DataSourceAmiga::SpriteAmiga,std::allocator<DataSourceAmiga::SpriteAmiga>,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_DataSourceLegacy).super_DataSourceBase.path,(SpriteAmiga **)this,
             (allocator<DataSourceAmiga::SpriteAmiga> *)&local_61,local_20 + 1,local_20);
  std::__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<DataSourceAmiga::SpriteAmiga,DataSourceAmiga::SpriteAmiga>
            ((__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2> *)this,
             (SpriteAmiga *)
             (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source);
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_30 = *in_RDX;
  local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_30,1,0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_40 = *in_RDX;
  local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_40,0,1);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_50 = *in_RDX;
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_50,2,1);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_60 = *in_RDX;
  local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_60,1,2);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  (**(code **)(*pp_Var1 + 0x50))(pp_Var1,0xffffffff);
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::make_shadow_from_symbol(PSpriteAmiga symbol) {
  PSpriteAmiga res = std::make_shared<SpriteAmiga>(10, 10);
  res->stick(symbol, 1, 0);
  res->stick(symbol, 0, 1);
  res->stick(symbol, 2, 1);
  res->stick(symbol, 1, 2);
  res->fill_masked({0xFF, 0xFF, 0xFF, 0xFF});
  return res;
}